

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zgsitrf.c
# Opt level: O0

void zgsitrf(superlu_options_t *options,SuperMatrix *A,int relax,int panel_size,int *etree,
            void *work,int_t lwork,int *perm_c,int *perm_r,SuperMatrix *L,SuperMatrix *U,
            GlobalLU_t *Glu,SuperLUStat_t *stat,int_t *info)

{
  doublecomplex drop_sum_00;
  doublecomplex drop_sum_01;
  int *piVar1;
  int_t iVar2;
  int iVar3;
  int iVar4;
  double *pdVar5;
  double dVar6;
  double dVar7;
  double local_318;
  double local_310;
  double *local_300;
  double local_2f0;
  double local_2e8;
  int local_2d8;
  double local_2d0;
  double local_2c8;
  int local_2b8;
  int local_2b0;
  int local_2ac;
  int local_2a8;
  int i_3;
  int quota_2;
  int last_1;
  int first_1;
  int error;
  int *marker2;
  int_t *lsub;
  int_t nzlmax;
  int_t nextl;
  int row;
  int i_2;
  double tmp;
  int i_1;
  int quota_1;
  int last;
  int first;
  int_t *xprune;
  double one;
  doublecomplex zero;
  double tol_U;
  double tol_L;
  int local_228;
  int nnzUj;
  int nnzLj;
  int nnzAj;
  int quota;
  int last_drop;
  flops_t *ops;
  int *panel_histo;
  int_t local_200;
  int_t nnzU;
  int_t nnzL;
  int iperm_r_allocated;
  int usepr;
  int w_def;
  int_t nextu;
  int_t nextlu;
  int_t new_next;
  int fsupc;
  int jsupno;
  int min_mn;
  int n;
  int m;
  int_t iinfo;
  int_t k;
  int_t i;
  int icol;
  int kcol;
  int jj;
  int jcol;
  int nseg;
  int nseg1;
  int pivrow;
  double fill_tol;
  milu_t milu;
  int drop_rule;
  double gamma;
  double fill_ini;
  double drop_tol;
  double diag_pivot_thresh;
  double *pdStack_170;
  fact_t fact;
  double *dwork2;
  double omega;
  double alpha;
  doublecomplex drop_sum;
  double *amax;
  int_t *piStack_138;
  int_t nzlumax;
  int_t *xusub;
  int_t *xlusup;
  int_t *xlsub;
  int *supno;
  int *xsup;
  int_t *xa_end;
  int_t *xa_begin;
  int_t *asub;
  doublecomplex *a;
  int *relax_fsupc;
  int *relax_end;
  double *dtempv;
  doublecomplex *tempv;
  doublecomplex *dense;
  int *marker_relax;
  int *marker;
  int *panel_lsub;
  int_t *xplore;
  int *parent;
  int *repfnz;
  int *segrep;
  doublecomplex *zwork;
  int *iwork;
  int *iswap;
  int *swap;
  int *iperm_c;
  int *iperm_r;
  NCPformat *Astore;
  void *work_local;
  int *etree_local;
  int panel_size_local;
  int relax_local;
  SuperMatrix *A_local;
  superlu_options_t *options_local;
  
  iperm_c = (int *)0x0;
  diag_pivot_thresh._4_4_ = options->Fact;
  drop_tol = options->DiagPivotThresh;
  tol_U = options->ILU_DropTol;
  gamma = options->ILU_FillTol;
  _milu = options->ILU_FillFactor;
  fill_tol._4_4_ = options->ILU_DropRule;
  fill_tol._0_4_ = options->ILU_MILU;
  nnzU = 0;
  ops = (flops_t *)stat->panel_histo;
  _quota = stat->ops;
  zero.i = tol_U;
  fill_ini = tol_U;
  Astore = (NCPformat *)work;
  work_local = etree;
  etree_local._0_4_ = panel_size;
  etree_local._4_4_ = relax;
  _panel_size_local = A;
  A_local = (SuperMatrix *)options;
  memset(&one,0,0x10);
  xprune = (int_t *)0x3ff0000000000000;
  n = 0;
  min_mn = _panel_size_local->nrow;
  jsupno = _panel_size_local->ncol;
  local_2b0 = jsupno;
  if (min_mn < jsupno) {
    local_2b0 = min_mn;
  }
  fsupc = local_2b0;
  iperm_r = (int *)_panel_size_local->Store;
  asub = *(int_t **)(iperm_r + 2);
  xa_begin = *(int_t **)(iperm_r + 4);
  xa_end = *(int_t **)(iperm_r + 6);
  xsup = *(int **)(iperm_r + 8);
  iVar2 = zLUMemInit(diag_pivot_thresh._4_4_,Astore,lwork,min_mn,jsupno,*iperm_r,(int)etree_local,
                     _milu,L,U,Glu,(int **)&zwork,(doublecomplex **)&segrep);
  *info = iVar2;
  if (*info == 0) {
    supno = Glu->xsup;
    xlsub = Glu->supno;
    xlusup = Glu->xlsub;
    xusub = Glu->xlusup;
    piStack_138 = Glu->xusub;
    SetIWork(min_mn,jsupno,(int)etree_local,(int *)zwork,&repfnz,&xplore,&panel_lsub,&parent,&marker
             ,(int_t **)&last,&marker_relax);
    dense = (doublecomplex *)int32Malloc(min_mn);
    superlu_free(_last);
    zSetRWork(min_mn,(int)etree_local,(doublecomplex *)segrep,&tempv,(doublecomplex **)&dtempv);
    nnzL = (int_t)(diag_pivot_thresh._4_4_ == SamePattern_SameRowPerm);
    if (nnzL != 0) {
      iperm_c = int32Malloc(min_mn);
      for (m = 0; m < min_mn; m = m + 1) {
        iperm_c[perm_r[m]] = m;
      }
      nnzU = 1;
    }
    swap = int32Malloc(jsupno);
    for (m = 0; m < jsupno; m = m + 1) {
      swap[perm_c[m]] = m;
    }
    iswap = intMalloc(jsupno);
    for (m = 0; m < jsupno; m = m + 1) {
      iswap[m] = swap[m];
    }
    iwork = intMalloc(jsupno);
    for (m = 0; m < jsupno; m = m + 1) {
      iwork[m] = perm_c[m];
    }
    drop_sum.i = (double)superlu_malloc((long)(int)etree_local << 3);
    if ((fill_tol._4_4_ & 0xe) == 0) {
      pdStack_170 = (double *)0x0;
    }
    else {
      pdStack_170 = (double *)superlu_malloc((long)jsupno << 3);
    }
    iVar4 = fsupc;
    nnzUj = 0;
    local_228 = 0;
    tol_L._4_4_ = 0;
    iVar3 = sp_ienv(7);
    local_2b8 = fsupc;
    if ((int)((double)fsupc * 0.95) < iVar4 + iVar3 * -2) {
      iVar4 = sp_ienv(7);
      local_2b8 = local_2b8 + iVar4 * -2;
    }
    else {
      local_2b8 = (int)((double)fsupc * 0.95);
    }
    nnzAj = local_2b8;
    omega = pow((double)jsupno,-1.0 / *(double *)(A_local + 3));
    relax_fsupc = intMalloc(jsupno);
    a = (doublecomplex *)intMalloc(jsupno);
    if (A_local[1].Stype == SLU_NCP) {
      ilu_heap_relax_snode
                (jsupno,(int *)work_local,etree_local._4_4_,marker_relax,relax_fsupc,(int *)a);
    }
    else {
      ilu_relax_snode(jsupno,(int *)work_local,etree_local._4_4_,marker_relax,relax_fsupc,(int *)a);
    }
    ifill(perm_r,min_mn,-1);
    ifill(marker_relax,min_mn * 3,-1);
    *xlsub = -1;
    *xusub = 0;
    *piStack_138 = 0;
    *xlusup = 0;
    *supno = 0;
    iperm_r_allocated = (int)etree_local;
    ifill((int *)dense,min_mn,-1);
    iinfo = mark_relax(min_mn,relax_fsupc,(int *)a,xa_end,xsup,xa_begin,(int *)dense);
    kcol = 0;
    while (kcol < fsupc) {
      if (relax_fsupc[kcol] == -1) {
        etree_local._0_4_ = iperm_r_allocated;
        m = kcol;
        do {
          m = m + 1;
          if (kcol + iperm_r_allocated < fsupc) {
            local_2d8 = kcol + iperm_r_allocated;
          }
          else {
            local_2d8 = fsupc;
          }
          if (local_2d8 <= m) goto LAB_00112a0c;
        } while (relax_fsupc[m] == -1);
        etree_local._0_4_ = m - kcol;
LAB_00112a0c:
        if (m == fsupc) {
          etree_local._0_4_ = fsupc - kcol;
        }
        ops[(int)etree_local] = (flops_t)((int)ops[(int)etree_local] + 1);
        ilu_zpanel_dfs(min_mn,(int)etree_local,kcol,_panel_size_local,perm_r,&jcol,tempv,
                       (double *)drop_sum.i,marker,repfnz,parent,marker_relax,xplore,panel_lsub,Glu)
        ;
        zpanel_bmod(min_mn,(int)etree_local,kcol,jcol,tempv,(doublecomplex *)dtempv,repfnz,parent,
                    Glu,stat);
        for (icol = kcol; icol < kcol + (int)etree_local; icol = icol + 1) {
          m = (icol - kcol) * min_mn;
          jj = jcol;
          nnzUj = (xsup[icol] - xa_end[icol]) + nnzUj;
          iVar4 = ilu_zcolumn_dfs(min_mn,icol,perm_r,&jj,marker + m,repfnz,parent + m,marker_relax,
                                  xplore,panel_lsub,Glu);
          *info = iVar4;
          if (iVar4 != 0) {
            return;
          }
          iVar4 = zcolumn_bmod(icol,jj - jcol,tempv + m,(doublecomplex *)dtempv,repfnz + jcol,
                               parent + m,kcol,Glu,stat);
          piVar1 = marker_relax;
          *info = iVar4;
          if (iVar4 != 0) {
            return;
          }
          if (xlusup[icol + 1] == xlusup[icol]) {
            lsub._0_4_ = Glu->nzlmax;
            marker2 = Glu->lsub;
            iVar4 = min_mn << 1;
            lsub._4_4_ = xlusup[icol] + 1;
            if ((int)lsub <= lsub._4_4_) {
              iVar2 = zLUMemXpand(icol,lsub._4_4_,LSUB,(int_t *)&lsub,Glu);
              if (iVar2 != 0) {
                *info = iVar2;
                return;
              }
              marker2 = Glu->lsub;
            }
            xlusup[icol + 1] = xlusup[icol + 1] + 1;
            if (xusub[icol] != xusub[icol + 1]) {
              __assert_fail("xlusup[jj]==xlusup[jj+1]",
                            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/zgsitrf.c"
                            ,0x1f5,
                            "void zgsitrf(superlu_options_t *, SuperMatrix *, int, int, int *, void *, int_t, int *, int *, SuperMatrix *, SuperMatrix *, GlobalLU_t *, SuperLUStat_t *, int_t *)"
                           );
            }
            xusub[icol + 1] = xusub[icol + 1] + 1;
            pdVar5 = (double *)((long)Glu->lusup + (long)xusub[icol] * 0x10);
            *pdVar5 = one;
            pdVar5[1] = zero.r;
            nextl = icol;
            while ((nextl < jsupno && (icol < *(int *)((long)&dense->r + (long)iswap[nextl] * 4))))
            {
              nextl = nextl + 1;
            }
            nzlmax = iswap[nextl];
            piVar1[(long)iVar4 + (long)nzlmax] = icol;
            marker2[xlusup[icol]] = nzlmax;
          }
          if ((fill_tol._4_4_ & 2) == 0) {
            if ((fill_tol._4_4_ & 4) == 0) {
              if ((fill_tol._4_4_ & 8) == 0) {
                nnzLj = min_mn;
              }
              else {
                nnzLj = (int)(_milu * 0.9 * (double)nnzUj * 0.5 + -(double)tol_L._4_4_);
              }
            }
            else {
              nnzLj = (int)((_milu * (double)(xsup[icol] - xa_end[icol]) * (double)(icol + 1)) /
                           (double)min_mn);
            }
          }
          else {
            nnzLj = (int)((((_milu * (double)*iperm_r) / (double)min_mn) * (double)icol) /
                         (double)min_mn);
          }
          iVar4 = ilu_zcopy_to_ucol(icol,jj,repfnz,parent + m,perm_r,tempv + m,fill_tol._4_4_,
                                    fill_tol._0_4_,
                                    *(double *)((long)drop_sum.i + (long)(icol - kcol) * 8) * zero.i
                                    ,nnzLj,(doublecomplex *)&alpha,(int *)((long)&tol_L + 4),Glu,
                                    pdStack_170);
          *info = iVar4;
          if (iVar4 != 0) {
            return;
          }
          if ((fill_tol._4_4_ & 0x10) != 0) {
            if ((double)local_228 <= _milu * 0.9 * (double)nnzUj * 0.5) {
              if (fill_ini <= zero.i * 0.5) {
                local_2f0 = zero.i * 0.5;
              }
              else {
                local_2f0 = fill_ini;
              }
              zero.i = local_2f0;
            }
            else {
              if (zero.i * 2.0 <= 1.0) {
                local_2e8 = zero.i * 2.0;
              }
              else {
                local_2e8 = 1.0;
              }
              zero.i = local_2e8;
            }
          }
          if ((((alpha != 0.0) || (NAN(alpha))) || (drop_sum.r != 0.0)) || (NAN(drop_sum.r))) {
            dVar7 = 1.0 - omega;
            dVar6 = z_abs1((doublecomplex *)&alpha);
            if (1.0 <= (dVar7 * 2.0) / dVar6) {
              local_300 = (double *)0x3ff0000000000000;
            }
            else {
              dVar7 = 1.0 - omega;
              dVar6 = z_abs1((doublecomplex *)&alpha);
              local_300 = (double *)((dVar7 * 2.0) / dVar6);
            }
            dwork2 = local_300;
            alpha = alpha * (double)local_300;
            drop_sum.r = drop_sum.r * (double)local_300;
          }
          if (nnzL != 0) {
            nseg = iperm_c[icol];
          }
          _nseg1 = pow(gamma,1.0 - (double)icol / (double)fsupc);
          drop_sum_01.i = drop_sum.r;
          drop_sum_01.r = alpha;
          iVar4 = ilu_zpivotL(icol,drop_tol,&nnzL,perm_r,swap[icol],iswap,iwork,(int *)dense,&nseg,
                              *(double *)((long)drop_sum.i + (long)(icol - kcol) * 8) * _nseg1,
                              fill_tol._0_4_,drop_sum_01,Glu,stat);
          *info = iVar4;
          if (iVar4 != 0) {
            n = n + 1;
            marker_relax[min_mn + nseg] = icol;
            marker_relax[min_mn * 2 + nseg] = icol;
          }
          resetrep_col(jj,repfnz,parent + m);
          if (((0 < icol) && (xlsub[icol + -1] < xlsub[icol])) && (icol < nnzAj)) {
            iVar4 = supno[xlsub[icol + -1]];
            iVar3 = icol + -1;
            if ((fill_tol._4_4_ & 2) == 0) {
              if ((fill_tol._4_4_ & 4) == 0) {
                if ((fill_tol._4_4_ & 8) == 0) {
                  local_2a8 = min_mn * jsupno;
                }
                else {
                  local_2a8 = (int)(_milu * (double)nnzUj *
                                    (1.0 - (((double)iVar3 + 1.0) * 0.5) / (double)min_mn) +
                                   -(double)local_228);
                }
              }
              else {
                local_2a8 = 0;
                for (local_2ac = iVar4; local_2ac <= iVar3; local_2ac = local_2ac + 1) {
                  local_2a8 = (xsup[local_2ac] - xa_end[local_2ac]) + local_2a8;
                }
                local_2a8 = (int)((_milu * (double)local_2a8 * (double)(min_mn - iVar4)) /
                                 (double)min_mn);
              }
            }
            else {
              local_2a8 = (int)(((((_milu * (double)*iperm_r) / (double)min_mn) *
                                 (double)(min_mn - iVar4)) / (double)min_mn) *
                               (double)((iVar3 - iVar4) + 1));
            }
            _nseg1 = pow(gamma,1.0 - ((double)(iVar4 + iVar3) * 0.5) / (double)fsupc);
            relax_end = (int *)dtempv;
            iinfo = ilu_zdrop_row((superlu_options_t *)A_local,iVar4,iVar3,tol_U,local_2a8,
                                  &local_228,(double *)&nseg1,Glu,dtempv,pdStack_170,1);
            if ((fill_tol._4_4_ & 0x10) != 0) {
              if ((double)local_228 <=
                  _milu * (double)nnzUj * (1.0 - (((double)iVar3 + 1.0) * 0.5) / (double)min_mn)) {
                if (fill_ini <= tol_U * 0.5) {
                  local_318 = tol_U * 0.5;
                }
                else {
                  local_318 = fill_ini;
                }
                tol_U = local_318;
              }
              else {
                if (tol_U * 2.0 <= 1.0) {
                  local_310 = tol_U * 2.0;
                }
                else {
                  local_310 = 1.0;
                }
                tol_U = local_310;
              }
            }
            if (_nseg1 < 0.0) {
              n = n - (int)_nseg1;
            }
          }
        }
        kcol = (int)etree_local + kcol;
      }
      else {
        i = relax_fsupc[kcol];
        iVar4 = (i - kcol) + 1;
        ops[iVar4] = (flops_t)((int)ops[iVar4] + 1);
        if ((0 < kcol) && (kcol < nnzAj)) {
          quota_1 = supno[xlsub[kcol + -1]];
          i_1 = kcol + -1;
          if ((fill_tol._4_4_ & 2) == 0) {
            if ((fill_tol._4_4_ & 4) == 0) {
              if ((fill_tol._4_4_ & 8) == 0) {
                tmp._4_4_ = min_mn * jsupno;
              }
              else {
                tmp._4_4_ = (int)(_milu * (double)nnzUj *
                                  (1.0 - (((double)i_1 + 1.0) * 0.5) / (double)min_mn) +
                                 -(double)local_228);
              }
            }
            else {
              tmp._4_4_ = 0;
              for (tmp._0_4_ = quota_1; tmp._0_4_ <= i_1; tmp._0_4_ = tmp._0_4_ + 1) {
                tmp._4_4_ = (xsup[tmp._0_4_] - xa_end[tmp._0_4_]) + tmp._4_4_;
              }
              tmp._4_4_ = (int)((_milu * (double)tmp._4_4_ * (double)(min_mn - quota_1)) /
                               (double)min_mn);
            }
          }
          else {
            tmp._4_4_ = (int)(((((_milu * (double)*iperm_r) / (double)min_mn) *
                               (double)(min_mn - quota_1)) / (double)min_mn) *
                             (double)((i_1 - quota_1) + 1));
          }
          _nseg1 = pow(gamma,1.0 - ((double)(quota_1 + i_1) * 0.5) / (double)fsupc);
          relax_end = (int *)dtempv;
          iinfo = ilu_zdrop_row((superlu_options_t *)A_local,quota_1,i_1,tol_U,tmp._4_4_,&local_228,
                                (double *)&nseg1,Glu,dtempv,pdStack_170,0);
          if ((fill_tol._4_4_ & 0x10) != 0) {
            if ((double)local_228 <=
                _milu * (double)nnzUj * (1.0 - (((double)i_1 + 1.0) * 0.5) / (double)min_mn)) {
              if (fill_ini <= tol_U * 0.5) {
                local_2d0 = tol_U * 0.5;
              }
              else {
                local_2d0 = fill_ini;
              }
              tol_U = local_2d0;
            }
            else {
              if (tol_U * 2.0 <= 1.0) {
                local_2c8 = tol_U * 2.0;
              }
              else {
                local_2c8 = 1.0;
              }
              tol_U = local_2c8;
            }
          }
          if (_nseg1 < 0.0) {
            n = n - (int)_nseg1;
          }
        }
        iVar4 = ilu_zsnode_dfs(kcol,i,xa_begin,xa_end,xsup,marker_relax,Glu);
        *info = iVar4;
        if (iVar4 != 0) {
          return;
        }
        usepr = piStack_138[kcol];
        w_def = xusub[kcol];
        new_next = xlsub[kcol];
        nextlu = supno[new_next];
        nextu = w_def + (xlusup[nextlu + 1] - xlusup[nextlu]) * ((i - kcol) + 1);
        amax._4_4_ = Glu->nzlumax;
        while (amax._4_4_ < nextu) {
          iVar2 = zLUMemXpand(kcol,w_def,LUSUP,(int_t *)((long)&amax + 4),Glu);
          *info = iVar2;
          if (iVar2 != 0) {
            return;
          }
        }
        for (k = kcol; k <= i; k = k + 1) {
          piStack_138[k + 1] = usepr;
          *(undefined8 *)drop_sum.i = 0;
          for (m = xa_end[k]; m < xsup[k]; m = m + 1) {
            _row = z_abs1((doublecomplex *)(asub + (long)m * 4));
            if (*(double *)drop_sum.i <= _row && _row != *(double *)drop_sum.i) {
              *(double *)drop_sum.i = _row;
            }
            iVar4 = xa_begin[m];
            tempv[iVar4].r = *(double *)(asub + (long)m * 4);
            tempv[iVar4].i = *(double *)((long)(asub + (long)m * 4) + 8);
          }
          nnzUj = (xsup[k] - xa_end[k]) + nnzUj;
          if ((*(double *)drop_sum.i == 0.0) && (!NAN(*(double *)drop_sum.i))) {
            *(double *)drop_sum.i = gamma;
          }
          zsnode_bmod(k,new_next,nextlu,tempv,(doublecomplex *)dtempv,Glu,stat);
          if (nnzL != 0) {
            nseg = iperm_c[k];
          }
          _nseg1 = pow(gamma,1.0 - (double)k / (double)fsupc);
          drop_sum_00.i = zero.r;
          drop_sum_00.r = one;
          iVar4 = ilu_zpivotL(k,drop_tol,&nnzL,perm_r,swap[k],iswap,iwork,(int *)dense,&nseg,
                              *(double *)drop_sum.i * _nseg1,fill_tol._0_4_,drop_sum_00,Glu,stat);
          *info = iVar4;
          if (iVar4 != 0) {
            n = n + 1;
            marker_relax[nseg] = i;
          }
        }
        kcol = i + 1;
      }
    }
    *info = n;
    if (jsupno < min_mn) {
      m = 0;
      for (iinfo = 0; iinfo < min_mn; iinfo = iinfo + 1) {
        if (perm_r[iinfo] == -1) {
          perm_r[iinfo] = jsupno + m;
          m = m + 1;
        }
      }
    }
    ilu_countnz(fsupc,&local_200,(int_t *)((long)&panel_histo + 4),Glu);
    fixupL(fsupc,perm_r,Glu);
    zLUWorkFree((int *)zwork,(doublecomplex *)segrep,Glu);
    superlu_free(panel_lsub);
    superlu_free(dense);
    if (diag_pivot_thresh._4_4_ == SamePattern_SameRowPerm) {
      *(int_t *)L->Store = local_200;
      *(int *)((long)L->Store + 4) = Glu->supno[jsupno];
      *(void **)((long)L->Store + 8) = Glu->lusup;
      *(int_t **)((long)L->Store + 0x10) = Glu->xlusup;
      *(int_t **)((long)L->Store + 0x18) = Glu->lsub;
      *(int_t **)((long)L->Store + 0x20) = Glu->xlsub;
      *(int_t *)U->Store = panel_histo._4_4_;
      *(void **)((long)U->Store + 8) = Glu->ucol;
      *(int_t **)((long)U->Store + 0x10) = Glu->usub;
      *(int_t **)((long)U->Store + 0x18) = Glu->xusub;
    }
    else {
      zCreate_SuperNode_Matrix
                (L,_panel_size_local->nrow,fsupc,local_200,(doublecomplex *)Glu->lusup,Glu->xlusup,
                 Glu->lsub,Glu->xlsub,Glu->supno,Glu->xsup,SLU_SC,SLU_Z,SLU_TRLU);
      zCreate_CompCol_Matrix
                (U,fsupc,fsupc,panel_histo._4_4_,(doublecomplex *)Glu->ucol,Glu->usub,Glu->xusub,
                 SLU_NC,SLU_Z,SLU_TRU);
    }
    _quota[7] = _quota[0x13] + _quota[0x14] + _quota[7];
    iVar4 = Glu->num_expansions + -1;
    Glu->num_expansions = iVar4;
    stat->expansions = iVar4;
    if (nnzU != 0) {
      superlu_free(iperm_c);
    }
    superlu_free(swap);
    superlu_free(relax_fsupc);
    superlu_free(iswap);
    superlu_free(iwork);
    superlu_free(a);
    superlu_free((void *)drop_sum.i);
    if (pdStack_170 != (double *)0x0) {
      superlu_free(pdStack_170);
    }
  }
  return;
}

Assistant:

void
zgsitrf(superlu_options_t *options, SuperMatrix *A, int relax, int panel_size,
	int *etree, void *work, int_t lwork, int *perm_c, int *perm_r,
	SuperMatrix *L, SuperMatrix *U, 
    	GlobalLU_t *Glu, /* persistent to facilitate multiple factorizations */
	SuperLUStat_t *stat, int_t *info)
{
    /* Local working arrays */
    NCPformat *Astore;
    int       *iperm_r = NULL; /* inverse of perm_r; used when
				  options->Fact == SamePattern_SameRowPerm */
    int       *iperm_c; /* inverse of perm_c */
    int       *swap, *iswap; /* swap is used to store the row permutation
				during the factorization. Initially, it is set
				to iperm_c (row indices of Pc*A*Pc').
				iswap is the inverse of swap. After the
				factorization, it is equal to perm_r. */
    int       *iwork;
    doublecomplex   *zwork;
    int       *segrep, *repfnz, *parent;
    int_t     *xplore;
    int       *panel_lsub; /* dense[]/panel_lsub[] pair forms a w-wide SPA */
    int       *marker;
    int       *marker_relax;
    doublecomplex    *dense, *tempv;
    double *dtempv;
    int       *relax_end, *relax_fsupc;
    doublecomplex    *a;
    int_t     *asub;
    int_t     *xa_begin, *xa_end;
    int       *xsup, *supno;
    int_t     *xlsub, *xlusup, *xusub;
    int_t     nzlumax;
    double    *amax; 
    doublecomplex    drop_sum;
    double alpha, omega;  /* used in MILU, mimicking DRIC */
    double    *dwork2;	   /* used by the second dropping rule */

    /* Local scalars */
    fact_t    fact = options->Fact;
    double    diag_pivot_thresh = options->DiagPivotThresh;
    double    drop_tol = options->ILU_DropTol; /* tau */
    double    fill_ini = options->ILU_FillTol; /* tau^hat */
    double    gamma = options->ILU_FillFactor;
    int       drop_rule = options->ILU_DropRule;
    milu_t    milu = options->ILU_MILU;
    double    fill_tol;
    int       pivrow;	/* pivotal row number in the original matrix A */
    int       nseg1;	/* no of segments in U-column above panel row jcol */
    int       nseg;	/* no of segments in each U-column */
    register int jcol, jj;
    register int kcol;	/* end column of a relaxed snode */
    register int icol;
    int_t     i, k, iinfo;
    int       m, n, min_mn, jsupno, fsupc;
    int_t     new_next, nextlu, nextu;
    int       w_def;	/* upper bound on panel width */
    int       usepr, iperm_r_allocated = 0;
    int_t     nnzL, nnzU;
    int       *panel_histo = stat->panel_histo;
    flops_t   *ops = stat->ops;

    int       last_drop;/* the last column which the dropping rules applied */
    int       quota;
    int       nnzAj;	/* number of nonzeros in A(:,1:j) */
    int       nnzLj, nnzUj;
    double    tol_L = drop_tol, tol_U = drop_tol;
    doublecomplex zero = {0.0, 0.0};
    double one = 1.0;

    /* Executable */	   
    iinfo    = 0;
    m	     = A->nrow;
    n	     = A->ncol;
    min_mn   = SUPERLU_MIN(m, n);
    Astore   = A->Store;
    a	     = Astore->nzval;
    asub     = Astore->rowind;
    xa_begin = Astore->colbeg;
    xa_end   = Astore->colend;

    /* Allocate storage common to the factor routines */
    *info = zLUMemInit(fact, work, lwork, m, n, Astore->nnz, panel_size,
		       gamma, L, U, Glu, &iwork, &zwork);
    if ( *info ) return;

    xsup    = Glu->xsup;
    supno   = Glu->supno;
    xlsub   = Glu->xlsub;
    xlusup  = Glu->xlusup;
    xusub   = Glu->xusub;

    int_t *xprune;
    SetIWork(m, n, panel_size, iwork, &segrep, &parent, &xplore,
	     &repfnz, &panel_lsub, &xprune, &marker);
    marker_relax = int32Malloc(m);
    SUPERLU_FREE(xprune); /* not used in ILU */
    
    zSetRWork(m, panel_size, zwork, &dense, &tempv);

    usepr = (fact == SamePattern_SameRowPerm);
    if ( usepr ) {
	/* Compute the inverse of perm_r */
	iperm_r = (int *) int32Malloc(m);
	for (k = 0; k < m; ++k) iperm_r[perm_r[k]] = k;
	iperm_r_allocated = 1;
    }

    iperm_c = (int *) int32Malloc(n);
    for (k = 0; k < n; ++k) iperm_c[perm_c[k]] = k;
    swap = (int *)intMalloc(n);
    for (k = 0; k < n; k++) swap[k] = iperm_c[k];
    iswap = (int *)intMalloc(n);
    for (k = 0; k < n; k++) iswap[k] = perm_c[k];
    amax = (double *) SUPERLU_MALLOC(panel_size * sizeof(double));
    if (drop_rule & DROP_SECONDARY)
	dwork2 = SUPERLU_MALLOC(n * sizeof(double));
    else
	dwork2 = NULL;

    nnzAj = 0;
    nnzLj = 0;
    nnzUj = 0;
    last_drop = SUPERLU_MAX(min_mn - 2 * sp_ienv(7), (int)(min_mn * 0.95));
    alpha = pow((double)n, -1.0 / options->ILU_MILU_Dim);

    /* Identify relaxed snodes */
    relax_end = (int *) intMalloc(n);
    relax_fsupc = (int *) intMalloc(n);
    if ( options->SymmetricMode == YES )
	ilu_heap_relax_snode(n, etree, relax, marker, relax_end, relax_fsupc);
    else
	ilu_relax_snode(n, etree, relax, marker, relax_end, relax_fsupc);

    ifill (perm_r, m, SLU_EMPTY);
    ifill (marker, m * NO_MARKER, SLU_EMPTY);
    supno[0] = -1;
    xsup[0]  = xlsub[0] = xusub[0] = xlusup[0] = 0;
    w_def    = panel_size;

    /* Mark the rows used by relaxed supernodes */
    ifill (marker_relax, m, SLU_EMPTY);
    i = mark_relax(m, relax_end, relax_fsupc, xa_begin, xa_end,
	         asub, marker_relax);
#if ( PRNTlevel >= 1)
    printf("%d relaxed supernodes.\n", (int)i);
#endif

    /*
     * Work on one "panel" at a time. A panel is one of the following:
     *	   (a) a relaxed supernode at the bottom of the etree, or
     *	   (b) panel_size contiguous columns, defined by the user
     */
    for (jcol = 0; jcol < min_mn; ) {

	if ( relax_end[jcol] != SLU_EMPTY ) { /* start of a relaxed snode */
	    kcol = relax_end[jcol];	  /* end of the relaxed snode */
	    panel_histo[kcol-jcol+1]++;

	    /* Drop small rows in the previous supernode. */
	    if (jcol > 0 && jcol < last_drop) {
		int first = xsup[supno[jcol - 1]];
		int last = jcol - 1;
		int quota;

		/* Compute the quota */
		if (drop_rule & DROP_PROWS)
		    quota = gamma * Astore->nnz / m * (m - first) / m
			    * (last - first + 1);
		else if (drop_rule & DROP_COLUMN) {
		    int i;
		    quota = 0;
		    for (i = first; i <= last; i++)
			quota += xa_end[i] - xa_begin[i];
		    quota = gamma * quota * (m - first) / m;
		} else if (drop_rule & DROP_AREA)
		    quota = gamma * nnzAj * (1.0 - 0.5 * (last + 1.0) / m)
			    - nnzLj;
		else
		    quota = m * n;
		fill_tol = pow(fill_ini, 1.0 - 0.5 * (first + last) / min_mn);

		/* Drop small rows */
                dtempv = (double *) tempv;
		i = ilu_zdrop_row(options, first, last, tol_L, quota, &nnzLj,
				  &fill_tol, Glu, dtempv, dwork2, 0);
		/* Reset the parameters */
		if (drop_rule & DROP_DYNAMIC) {
		    if (gamma * nnzAj * (1.0 - 0.5 * (last + 1.0) / m)
			     < nnzLj)
			tol_L = SUPERLU_MIN(1.0, tol_L * 2.0);
		    else
			tol_L = SUPERLU_MAX(drop_tol, tol_L * 0.5);
		}
		if (fill_tol < 0) iinfo -= (int)fill_tol;
#ifdef DEBUG
		num_drop_L += i * (last - first + 1);
#endif
	    }

	    /* --------------------------------------
	     * Factorize the relaxed supernode(jcol:kcol)
	     * -------------------------------------- */
	    /* Determine the union of the row structure of the snode */
	    if ( (*info = ilu_zsnode_dfs(jcol, kcol, asub, xa_begin, xa_end,
					 marker, Glu)) != 0 )
		return;

	    nextu    = xusub[jcol];
	    nextlu   = xlusup[jcol];
	    jsupno   = supno[jcol];
	    fsupc    = xsup[jsupno];
	    new_next = nextlu + (xlsub[fsupc+1]-xlsub[fsupc])*(kcol-jcol+1);
	    nzlumax = Glu->nzlumax;
	    while ( new_next > nzlumax ) {
		if ((*info = zLUMemXpand(jcol, nextlu, LUSUP, &nzlumax, Glu)))
		    return;
	    }

	    for (icol = jcol; icol <= kcol; icol++) {
		xusub[icol+1] = nextu;

		amax[0] = 0.0;
		/* Scatter into SPA dense[*] */
		for (k = xa_begin[icol]; k < xa_end[icol]; k++) {
                    register double tmp = z_abs1 (&a[k]);
		    if (tmp > amax[0]) amax[0] = tmp;
		    dense[asub[k]] = a[k];
		}
		nnzAj += xa_end[icol] - xa_begin[icol];
		if (amax[0] == 0.0) {
		    amax[0] = fill_ini;
#if ( PRNTlevel >= 1)
		    printf("Column %d is entirely zero!\n", icol);
		    fflush(stdout);
#endif
		}

		/* Numeric update within the snode */
		zsnode_bmod(icol, jsupno, fsupc, dense, tempv, Glu, stat);

		if (usepr) pivrow = iperm_r[icol];
		fill_tol = pow(fill_ini, 1.0 - (double)icol / (double)min_mn);
		if ( (*info = ilu_zpivotL(icol, diag_pivot_thresh, &usepr,
					  perm_r, iperm_c[icol], swap, iswap,
					  marker_relax, &pivrow,
                                          amax[0] * fill_tol, milu, zero,
                                          Glu, stat)) ) {
		    iinfo++;
		    marker[pivrow] = kcol;
		}

	    }

	    jcol = kcol + 1;

	} else { /* Work on one panel of panel_size columns */

	    /* Adjust panel_size so that a panel won't overlap with the next
	     * relaxed snode.
	     */
	    panel_size = w_def;
	    for (k = jcol + 1; k < SUPERLU_MIN(jcol+panel_size, min_mn); k++)
		if ( relax_end[k] != SLU_EMPTY ) {
		    panel_size = k - jcol;
		    break;
		}
	    if ( k == min_mn ) panel_size = min_mn - jcol;
	    panel_histo[panel_size]++;

	    /* symbolic factor on a panel of columns */
	    ilu_zpanel_dfs(m, panel_size, jcol, A, perm_r, &nseg1,
                          dense, amax, panel_lsub, segrep, repfnz,
                          marker, parent, xplore, Glu);

	    /* numeric sup-panel updates in topological order */
	    zpanel_bmod(m, panel_size, jcol, nseg1, dense,
			tempv, segrep, repfnz, Glu, stat);

	    /* Sparse LU within the panel, and below panel diagonal */
	    for (jj = jcol; jj < jcol + panel_size; jj++) {

		k = (jj - jcol) * m; /* column index for w-wide arrays */

		nseg = nseg1;	/* Begin after all the panel segments */

		nnzAj += xa_end[jj] - xa_begin[jj];

		if ((*info = ilu_zcolumn_dfs(m, jj, perm_r, &nseg,
					     &panel_lsub[k], segrep, &repfnz[k],
					     marker, parent, xplore, Glu)))
		    return;

		/* Numeric updates */
		if ((*info = zcolumn_bmod(jj, (nseg - nseg1), &dense[k],
					  tempv, &segrep[nseg1], &repfnz[k],
					  jcol, Glu, stat)) != 0) return;

		/* Make a fill-in position if the column is entirely zero */
		if (xlsub[jj + 1] == xlsub[jj]) {
		    register int i, row;
		    int_t nextl;
		    int_t nzlmax = Glu->nzlmax;
		    int_t *lsub = Glu->lsub;
		    int *marker2 = marker + 2 * m;

		    /* Allocate memory */
		    nextl = xlsub[jj] + 1;
		    if (nextl >= nzlmax) {
			int error = zLUMemXpand(jj, nextl, LSUB, &nzlmax, Glu);
			if (error) { *info = error; return; }
			lsub = Glu->lsub;
		    }
		    xlsub[jj + 1]++;
		    assert(xlusup[jj]==xlusup[jj+1]);
		    xlusup[jj + 1]++;
		    ((doublecomplex *) Glu->lusup)[xlusup[jj]] = zero;

		    /* Choose a row index (pivrow) for fill-in */
		    for (i = jj; i < n; i++)
			if (marker_relax[swap[i]] <= jj) break;
		    row = swap[i];
		    marker2[row] = jj;
		    lsub[xlsub[jj]] = row;
#ifdef DEBUG
		    printf("Fill col %d.\n", (int)jj);
		    fflush(stdout);
#endif
		}

		/* Computer the quota */
		if (drop_rule & DROP_PROWS)
		    quota = gamma * Astore->nnz / m * jj / m;
		else if (drop_rule & DROP_COLUMN)
		    quota = gamma * (xa_end[jj] - xa_begin[jj]) *
			    (jj + 1) / m;
		else if (drop_rule & DROP_AREA)
		    quota = gamma * 0.9 * nnzAj * 0.5 - nnzUj;
		else
		    quota = m;

		/* Copy the U-segments to ucol[*] and drop small entries */
		if ((*info = ilu_zcopy_to_ucol(jj, nseg, segrep, &repfnz[k],
					       perm_r, &dense[k], drop_rule,
					       milu, amax[jj - jcol] * tol_U,
					       quota, &drop_sum, &nnzUj, Glu,
					       dwork2)) != 0)
		    return;

		/* Reset the dropping threshold if required */
		if (drop_rule & DROP_DYNAMIC) {
		    if (gamma * 0.9 * nnzAj * 0.5 < nnzLj)
			tol_U = SUPERLU_MIN(1.0, tol_U * 2.0);
		    else
			tol_U = SUPERLU_MAX(drop_tol, tol_U * 0.5);
		}

		if (drop_sum.r != 0.0 || drop_sum.i != 0.0)
		{
                    omega = SUPERLU_MIN(2.0*(1.0-alpha)/z_abs1(&drop_sum), 1.0);
                    zd_mult(&drop_sum, &drop_sum, omega);
		}
		if (usepr) pivrow = iperm_r[jj];
		fill_tol = pow(fill_ini, 1.0 - (double)jj / (double)min_mn);
		if ( (*info = ilu_zpivotL(jj, diag_pivot_thresh, &usepr, perm_r,
					  iperm_c[jj], swap, iswap,
					  marker_relax, &pivrow,
					  amax[jj - jcol] * fill_tol, milu,
					  drop_sum, Glu, stat)) ) {
		    iinfo++;
		    marker[m + pivrow] = jj;
		    marker[2 * m + pivrow] = jj;
		}

		/* Reset repfnz[] for this column */
		resetrep_col (nseg, segrep, &repfnz[k]);

		/* Start a new supernode, drop the previous one */
		if (jj > 0 && supno[jj] > supno[jj - 1] && jj < last_drop) {
		    int first = xsup[supno[jj - 1]];
		    int last = jj - 1;
		    int quota;

		    /* Compute the quota */
		    if (drop_rule & DROP_PROWS)
			quota = gamma * Astore->nnz / m * (m - first) / m
				* (last - first + 1);
		    else if (drop_rule & DROP_COLUMN) {
			int i;
			quota = 0;
			for (i = first; i <= last; i++)
			    quota += xa_end[i] - xa_begin[i];
			quota = gamma * quota * (m - first) / m;
		    } else if (drop_rule & DROP_AREA)
			quota = gamma * nnzAj * (1.0 - 0.5 * (last + 1.0)
				/ m) - nnzLj;
		    else
			quota = m * n;
		    fill_tol = pow(fill_ini, 1.0 - 0.5 * (first + last) /
			    (double)min_mn);

		    /* Drop small rows */
                    dtempv = (double *) tempv;
		    i = ilu_zdrop_row(options, first, last, tol_L, quota,
				      &nnzLj, &fill_tol, Glu, dtempv, dwork2,
				      1);

		    /* Reset the parameters */
		    if (drop_rule & DROP_DYNAMIC) {
			if (gamma * nnzAj * (1.0 - 0.5 * (last + 1.0) / m)
				< nnzLj)
			    tol_L = SUPERLU_MIN(1.0, tol_L * 2.0);
			else
			    tol_L = SUPERLU_MAX(drop_tol, tol_L * 0.5);
		    }
		    if (fill_tol < 0) iinfo -= (int)fill_tol;
#ifdef DEBUG
		    num_drop_L += i * (last - first + 1);
#endif
		} /* if start a new supernode */

	    } /* for */

	    jcol += panel_size; /* Move to the next panel */

	} /* else */

    } /* for */

    *info = iinfo;

    if ( m > n ) {
	k = 0;
	for (i = 0; i < m; ++i)
	    if ( perm_r[i] == SLU_EMPTY ) {
		perm_r[i] = n + k;
		++k;
	    }
    }

    ilu_countnz(min_mn, &nnzL, &nnzU, Glu);
    fixupL(min_mn, perm_r, Glu);

    zLUWorkFree(iwork, zwork, Glu); /* Free work space and compress storage */
    SUPERLU_FREE (xplore);
    SUPERLU_FREE (marker_relax);

    if ( fact == SamePattern_SameRowPerm ) {
	/* L and U structures may have changed due to possibly different
	   pivoting, even though the storage is available.
	   There could also be memory expansions, so the array locations
	   may have changed, */
	((SCformat *)L->Store)->nnz = nnzL;
	((SCformat *)L->Store)->nsuper = Glu->supno[n];
	((SCformat *)L->Store)->nzval = (doublecomplex *) Glu->lusup;
	((SCformat *)L->Store)->nzval_colptr = Glu->xlusup;
	((SCformat *)L->Store)->rowind = Glu->lsub;
	((SCformat *)L->Store)->rowind_colptr = Glu->xlsub;
	((NCformat *)U->Store)->nnz = nnzU;
	((NCformat *)U->Store)->nzval = (doublecomplex *) Glu->ucol;
	((NCformat *)U->Store)->rowind = Glu->usub;
	((NCformat *)U->Store)->colptr = Glu->xusub;
    } else {
	zCreate_SuperNode_Matrix(L, A->nrow, min_mn, nnzL,
              (doublecomplex *) Glu->lusup, Glu->xlusup,
              Glu->lsub, Glu->xlsub, Glu->supno, Glu->xsup,
	      SLU_SC, SLU_Z, SLU_TRLU);
	zCreate_CompCol_Matrix(U, min_mn, min_mn, nnzU,
	      (doublecomplex *) Glu->ucol, Glu->usub, Glu->xusub,
	      SLU_NC, SLU_Z, SLU_TRU);
    }

    ops[FACT] += ops[TRSV] + ops[GEMV];
    stat->expansions = --(Glu->num_expansions);

    if ( iperm_r_allocated ) SUPERLU_FREE (iperm_r);
    SUPERLU_FREE (iperm_c);
    SUPERLU_FREE (relax_end);
    SUPERLU_FREE (swap);
    SUPERLU_FREE (iswap);
    SUPERLU_FREE (relax_fsupc);
    SUPERLU_FREE (amax);
    if ( dwork2 ) SUPERLU_FREE (dwork2);

}